

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statements.h
# Opt level: O1

void slang::ast::checkDeferredAssertAction(Statement *stmt,ASTContext *context)

{
  if (stmt->kind < List) {
    return;
  }
  if ((stmt->kind == ExpressionStatement) &&
     (((*(CallExpression **)(stmt + 1))->super_Expression).kind == Call)) {
    AssertionExpr::checkAssertionCall
              (*(CallExpression **)(stmt + 1),context,(DiagCode)0xe0008,(DiagCode)0xd0008,
               (optional<slang::DiagCode>)0x1000f0008,stmt->sourceRange);
    return;
  }
  ASTContext::addDiag(context,(DiagCode)0x1c0008,stmt->sourceRange);
  return;
}

Assistant:

bool bad() const { return kind == StatementKind::Invalid; }